

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O3

void __thiscall
vkt::QueryPool::anon_unknown_0::StateObjects::StateObjects
          (StateObjects *this,DeviceInterface *vk,Context *context,int numVertices,
          VkPrimitiveTopology primitive)

{
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar1;
  deInt32 *pdVar2;
  int *piVar3;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar5;
  VkImageCreateFlags *pVVar6;
  VkFormat _format;
  SharedPtrStateBase *pSVar7;
  VkImage VVar8;
  VkImageView VVar9;
  VkRenderPass obj;
  VkFramebuffer obj_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var10;
  VkPipelineLayout obj_01;
  VkPipeline obj_02;
  VkSubpassDescription subpass;
  StencilOpState _front;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  StencilOpState _back;
  undefined8 uVar11;
  void *pvVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Handle<(vk::HandleType)18> HVar15;
  DeviceInterface *pDVar16;
  VkDevice pVVar17;
  VkAllocationCallbacks *pVVar18;
  VkAttachmentReference VVar19;
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar20;
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar21;
  Move<vk::Handle<(vk::HandleType)23>_> *pMVar22;
  VkDevice device;
  Allocator *pAVar23;
  const_iterator cVar24;
  long lVar25;
  ImageCreateInfo *pIVar26;
  undefined8 *puVar27;
  byte bVar28;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  VkAttachmentReference *_colorAttachments;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  ImageCreateInfo depthImageCreateInfo;
  pointer local_568;
  pointer local_560;
  pointer local_550;
  pointer local_548;
  pointer local_538;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachments;
  Move<vk::Handle<(vk::HandleType)18>_> local_4f8;
  VkAttachmentReference colorAttachmentReference;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_4d0;
  ImageViewCreateInfo depthViewInfo;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_468;
  Move<vk::Handle<(vk::HandleType)18>_> *local_448;
  Move<vk::Handle<(vk::HandleType)16>_> *local_440;
  Move<vk::Handle<(vk::HandleType)23>_> *local_438;
  SharedPtr<vkt::Draw::Image> *local_430;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_428;
  ImageViewCreateInfo attachmentViewInfo;
  pointer local_3b0;
  VkStencilOpState local_3a8;
  VkStencilOpState local_388;
  ImageCreateInfo colorImageCreateInfo;
  pointer local_2d8;
  pointer local_2c8;
  pointer local_270;
  pointer local_260;
  pointer local_e0;
  pointer local_d0;
  pointer local_c8;
  pointer local_b8;
  pointer local_b0;
  pointer local_a0;
  pointer local_98;
  pointer local_88;
  VkVertexInputBindingDescription vf_binding_desc;
  VkVertexInputAttributeDescription vf_attribute_desc;
  Attachment attachmentState;
  
  bVar28 = 0;
  this->m_context = context;
  local_448 = &this->m_pipeline;
  local_440 = &this->m_pipelineLayout;
  local_430 = &this->m_DepthImage;
  pMVar1 = &this->m_attachmentView;
  pMVar4 = &this->m_depthiew;
  pMVar5 = &this->m_renderPass;
  local_438 = &this->m_framebuffer;
  memset(local_448,0,0xf0);
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  device = Context::getDevice(context);
  _extent.depth = 1;
  _extent.width = 0x80;
  _extent.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&colorImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x11,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar23 = Context::getDefaultAllocator(this->m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthImageCreateInfo,vk,device,&colorImageCreateInfo.super_VkImageCreateInfo,
             pAVar23,(MemoryRequirement)0x0);
  pSVar7 = (this->m_colorAttachmentImage).m_state;
  if (pSVar7 == (SharedPtrStateBase *)depthImageCreateInfo.super_VkImageCreateInfo.pNext) {
LAB_006a0d28:
    if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
      LOCK();
      piVar3 = (int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8);
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
        (**(code **)(*depthImageCreateInfo.super_VkImageCreateInfo.pNext + 0x10))();
      }
      LOCK();
      piVar3 = (int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 0xc);
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if ((*piVar3 == 0) && (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0)) {
        (**(code **)(*depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8))();
      }
    }
  }
  else {
    if (pSVar7 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar2 = &pSVar7->strongRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        (this->m_colorAttachmentImage).m_ptr = (Image *)0x0;
        (*((this->m_colorAttachmentImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar2 = &((this->m_colorAttachmentImage).m_state)->weakRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        pSVar7 = (this->m_colorAttachmentImage).m_state;
        if (pSVar7 != (SharedPtrStateBase *)0x0) {
          (*pSVar7->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_colorAttachmentImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_colorAttachmentImage).m_ptr =
         (Image *)depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (this->m_colorAttachmentImage).m_state =
         (SharedPtrStateBase *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8) =
           *(int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar2 = &((this->m_colorAttachmentImage).m_state)->weakRefCount;
      *pdVar2 = *pdVar2 + 1;
      UNLOCK();
      goto LAB_006a0d28;
    }
  }
  VVar8.m_internal =
       (((this->m_colorAttachmentImage).m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  _format = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&depthImageCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G
             ,VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&attachmentViewInfo,VVar8,VK_IMAGE_VIEW_TYPE_2D,_format,
             (VkComponentMapping *)&depthImageCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&depthViewInfo,vk,device,
             &attachmentViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  VVar8 = depthViewInfo.super_VkImageViewCreateInfo.image;
  uVar13 = depthViewInfo.super_VkImageViewCreateInfo._16_8_;
  pvVar12 = depthViewInfo.super_VkImageViewCreateInfo.pNext;
  uVar11 = depthViewInfo.super_VkImageViewCreateInfo._0_8_;
  depthImageCreateInfo.super_VkImageCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.format =
       (undefined4)depthViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width =
       depthViewInfo.super_VkImageViewCreateInfo.image.m_internal._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  VVar9.m_internal =
       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar9.m_internal == 0) {
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)uVar13;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar8.m_internal;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar11;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar9);
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (depthViewInfo.super_VkImageViewCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                 &depthViewInfo.super_VkImageViewCreateInfo.pNext,
                 (VkImageView)depthViewInfo.super_VkImageViewCreateInfo._0_8_);
    }
  }
  uVar33 = 0;
  uVar34 = 0;
  uVar31 = 1;
  uVar32 = 0;
  uVar29 = 1;
  uVar30 = 0;
  _extent_00.depth = 1;
  _extent_00.width = 0x80;
  _extent_00.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&depthImageCreateInfo,VK_IMAGE_TYPE_2D,VK_FORMAT_D16_UNORM,_extent_00,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x20,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar23 = Context::getDefaultAllocator(this->m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthViewInfo,vk,device,&depthImageCreateInfo.super_VkImageCreateInfo,pAVar23
             ,(MemoryRequirement)0x0);
  pSVar7 = (this->m_DepthImage).m_state;
  if (pSVar7 == (SharedPtrStateBase *)depthViewInfo.super_VkImageViewCreateInfo.pNext) {
LAB_006a0f5c:
    if (depthViewInfo.super_VkImageViewCreateInfo.pNext != (void *)0x0) {
      LOCK();
      piVar3 = (int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8);
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
        (**(code **)(*depthViewInfo.super_VkImageViewCreateInfo.pNext + 0x10))();
      }
      LOCK();
      piVar3 = (int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 0xc);
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if ((*piVar3 == 0) && (depthViewInfo.super_VkImageViewCreateInfo.pNext != (void *)0x0)) {
        (**(code **)(*depthViewInfo.super_VkImageViewCreateInfo.pNext + 8))();
      }
    }
  }
  else {
    if (pSVar7 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar2 = &pSVar7->strongRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        (this->m_DepthImage).m_ptr = (Image *)0x0;
        (*((this->m_DepthImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar2 = &((this->m_DepthImage).m_state)->weakRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        pSVar7 = (this->m_DepthImage).m_state;
        if (pSVar7 != (SharedPtrStateBase *)0x0) {
          (*pSVar7->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_DepthImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_DepthImage).m_ptr = (Image *)depthViewInfo.super_VkImageViewCreateInfo._0_8_;
    (this->m_DepthImage).m_state =
         (SharedPtrStateBase *)depthViewInfo.super_VkImageViewCreateInfo.pNext;
    if (depthViewInfo.super_VkImageViewCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8) =
           *(int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar2 = &((this->m_DepthImage).m_state)->weakRefCount;
      *pdVar2 = *pdVar2 + 1;
      UNLOCK();
      goto LAB_006a0f5c;
    }
  }
  VVar8.m_internal =
       (local_430->m_ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
       m_internal;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&attachments,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&depthViewInfo,VVar8,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_D16_UNORM,
             (VkComponentMapping *)&attachments,0);
  _colorAttachments = &colorAttachmentReference;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)_colorAttachments,vk,device,
             &depthViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar18 = DStack_4d0.m_allocator;
  pVVar17 = DStack_4d0.m_device;
  pDVar16 = DStack_4d0.m_deviceIface;
  VVar19 = colorAttachmentReference;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)DStack_4d0.m_device;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)colorAttachmentReference;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)DStack_4d0.m_deviceIface;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  DStack_4d0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_4d0.m_device = (VkDevice)0x0;
  DStack_4d0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar9.m_internal =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar9.m_internal == 0) {
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         pVVar17;
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         pVVar18;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         (deUint64)VVar19;
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         pDVar16;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               VVar9);
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         (VkDevice)
         attachments.
         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         pVVar18;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         (deUint64)
         attachments.
         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         attachments.
         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (colorAttachmentReference != (VkAttachmentReference)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&DStack_4d0,(VkImageView)colorAttachmentReference);
    }
  }
  if (depthImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depthImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (colorImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colorImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)colorImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)colorImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            ((RenderPassCreateInfo *)&colorImageCreateInfo,0,(VkAttachmentDescription *)0x0,0,
             (VkSubpassDescription *)0x0,0,(VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,this->m_colorAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_GENERAL);
  attachment.samples = (int)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  attachment.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment.loadOp = (int)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  attachment.storeOp = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  attachment.stencilLoadOp = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  attachment.stencilStoreOp = depthImageCreateInfo.super_VkImageCreateInfo.format;
  attachment.initialLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  attachment.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,VK_FORMAT_D16_UNORM,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  attachment_00.samples = (int)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  attachment_00.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment_00.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment_00.loadOp = (int)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  attachment_00.storeOp = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  attachment_00.stencilLoadOp = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  attachment_00.stencilStoreOp = depthImageCreateInfo.super_VkImageCreateInfo.format;
  attachment_00.initialLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  attachment_00.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment_00);
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  uVar43 = 0;
  uVar44 = 0;
  uVar41 = 0;
  uVar42 = 0;
  uVar39 = 1;
  uVar40 = 3;
  uVar37 = 0;
  uVar38 = 0;
  uVar35 = 0x6a1213;
  uVar36 = 0;
  Draw::SubpassDescription::SubpassDescription
            ((SubpassDescription *)&depthImageCreateInfo,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,
             (VkAttachmentReference *)0x0,1,_colorAttachments,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)0x300000001,0,(deUint32 *)0x0);
  lVar25 = 9;
  pIVar26 = &depthImageCreateInfo;
  puVar27 = (undefined8 *)&stack0xfffffffffffff9c8;
  while( true ) {
    if (lVar25 == 0) break;
    lVar25 = lVar25 + -1;
    *puVar27 = *(undefined8 *)&pIVar26->super_VkImageCreateInfo;
    pIVar26 = (ImageCreateInfo *)((long)pIVar26 + (ulong)bVar28 * -0x10 + 8);
    puVar27 = puVar27 + (ulong)bVar28 * -2 + 1;
  }
  subpass.pipelineBindPoint = uVar30;
  subpass.flags = uVar29;
  subpass.inputAttachmentCount = uVar31;
  subpass._12_4_ = uVar32;
  subpass.pInputAttachments._0_4_ = uVar33;
  subpass.pInputAttachments._4_4_ = uVar34;
  subpass.colorAttachmentCount = uVar35;
  subpass._28_4_ = uVar36;
  subpass.pColorAttachments._0_4_ = (int)_colorAttachments;
  subpass.pColorAttachments._4_4_ = (int)((ulong)_colorAttachments >> 0x20);
  subpass.pResolveAttachments._0_4_ = uVar37;
  subpass.pResolveAttachments._4_4_ = uVar38;
  subpass.pDepthStencilAttachment._0_4_ = uVar39;
  subpass.pDepthStencilAttachment._4_4_ = uVar40;
  subpass.preserveAttachmentCount = uVar41;
  subpass._60_4_ = uVar42;
  subpass.pPreserveAttachments._0_4_ = uVar43;
  subpass.pPreserveAttachments._4_4_ = uVar44;
  Draw::RenderPassCreateInfo::addSubpass((RenderPassCreateInfo *)&colorImageCreateInfo,subpass);
  if (local_548 != (pointer)0x0) {
    operator_delete(local_548,(long)local_538 - (long)local_548);
  }
  if (local_560 != (pointer)0x0) {
    operator_delete(local_560,(long)local_550 - (long)local_560);
  }
  if (depthImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(depthImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                    (long)local_568 -
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish);
  }
  if (depthImageCreateInfo.super_VkImageCreateInfo.pQueueFamilyIndices != (deUint32 *)0x0) {
    operator_delete(depthImageCreateInfo.super_VkImageCreateInfo.pQueueFamilyIndices,
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)depthImageCreateInfo.super_VkImageCreateInfo.pQueueFamilyIndices);
  }
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&attachmentViewInfo,vk,device,
             (VkRenderPassCreateInfo *)&colorImageCreateInfo,(VkAllocationCallbacks *)0x0);
  VVar8 = attachmentViewInfo.super_VkImageViewCreateInfo.image;
  uVar13 = attachmentViewInfo.super_VkImageViewCreateInfo._16_8_;
  pvVar12 = attachmentViewInfo.super_VkImageViewCreateInfo.pNext;
  uVar11 = attachmentViewInfo.super_VkImageViewCreateInfo._0_8_;
  depthImageCreateInfo.super_VkImageCreateInfo.flags =
       attachmentViewInfo.super_VkImageViewCreateInfo.flags;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType =
       attachmentViewInfo.super_VkImageViewCreateInfo._20_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.format =
       (undefined4)attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width =
       attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.sType =
       attachmentViewInfo.super_VkImageViewCreateInfo.sType;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       attachmentViewInfo.super_VkImageViewCreateInfo._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       attachmentViewInfo.super_VkImageViewCreateInfo.pNext;
  attachmentViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  attachmentViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  attachmentViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  attachmentViewInfo.super_VkImageViewCreateInfo.flags = 0;
  attachmentViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  obj.m_internal = (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal
  ;
  if (obj.m_internal == 0) {
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)uVar13;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VVar8.m_internal;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal = uVar11;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj);
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (attachmentViewInfo.super_VkImageViewCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)
                 &attachmentViewInfo.super_VkImageViewCreateInfo.pNext,
                 (VkRenderPass)attachmentViewInfo.super_VkImageViewCreateInfo._0_8_);
    }
  }
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  (attachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].m_internal =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            ((FramebufferCreateInfo *)&depthImageCreateInfo,
             (VkRenderPass)
             (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             &attachments,0x80,0x80,1);
  pMVar22 = local_438;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&depthViewInfo,vk,device,
             (VkFramebufferCreateInfo *)&depthImageCreateInfo,(VkAllocationCallbacks *)0x0);
  VVar8 = depthViewInfo.super_VkImageViewCreateInfo.image;
  uVar13 = depthViewInfo.super_VkImageViewCreateInfo._16_8_;
  pvVar12 = depthViewInfo.super_VkImageViewCreateInfo.pNext;
  uVar11 = depthViewInfo.super_VkImageViewCreateInfo._0_8_;
  attachmentViewInfo.super_VkImageViewCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  attachmentViewInfo.super_VkImageViewCreateInfo._20_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.image =
       depthViewInfo.super_VkImageViewCreateInfo.image;
  attachmentViewInfo.super_VkImageViewCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  attachmentViewInfo.super_VkImageViewCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  obj_00.m_internal =
       (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_device =
         (VkDevice)uVar13;
    (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VVar8.m_internal;
    (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal = uVar11;
    (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_00);
    (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_device =
         (VkDevice)attachmentViewInfo.super_VkImageViewCreateInfo._16_8_;
    (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal;
    (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
         attachmentViewInfo.super_VkImageViewCreateInfo._0_8_;
    (pMVar22->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)attachmentViewInfo.super_VkImageViewCreateInfo.pNext;
    if (depthViewInfo.super_VkImageViewCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
                 &depthViewInfo.super_VkImageViewCreateInfo.pNext,
                 (VkFramebuffer)depthViewInfo.super_VkImageViewCreateInfo._0_8_);
    }
  }
  if (attachments.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo((RenderPassCreateInfo *)&colorImageCreateInfo);
  p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)this->m_context->m_progCollection;
  pVVar6 = &depthImageCreateInfo.super_VkImageCreateInfo.flags;
  depthImageCreateInfo.super_VkImageCreateInfo._0_8_ = pVVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&depthImageCreateInfo,"vert","");
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var10,(key_type *)&depthImageCreateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&colorImageCreateInfo,vk,device,
             *(ProgramBinary **)(cVar24._M_node + 2),0);
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)colorImageCreateInfo.super_VkImageCreateInfo._16_8_;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)colorImageCreateInfo.super_VkImageCreateInfo._0_8_;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)colorImageCreateInfo.super_VkImageCreateInfo.pNext;
  colorImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
  colorImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  colorImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_UNDEFINED;
  colorImageCreateInfo.super_VkImageCreateInfo.extent.width = 0;
  if ((VkImageCreateFlags *)depthImageCreateInfo.super_VkImageCreateInfo._0_8_ != pVVar6) {
    operator_delete((void *)depthImageCreateInfo.super_VkImageCreateInfo._0_8_,
                    depthImageCreateInfo.super_VkImageCreateInfo._16_8_ + 1);
  }
  p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)this->m_context->m_progCollection;
  depthImageCreateInfo.super_VkImageCreateInfo._0_8_ = pVVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&depthImageCreateInfo,"frag","");
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var10,(key_type *)&depthImageCreateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&colorImageCreateInfo,vk,device,
             *(ProgramBinary **)(cVar24._M_node + 2),0);
  DStack_4d0.m_device = (VkDevice)colorImageCreateInfo.super_VkImageCreateInfo._16_8_;
  DStack_4d0.m_allocator =
       (VkAllocationCallbacks *)colorImageCreateInfo.super_VkImageCreateInfo._24_8_;
  colorAttachmentReference.attachment = colorImageCreateInfo.super_VkImageCreateInfo.sType;
  colorAttachmentReference.layout = colorImageCreateInfo.super_VkImageCreateInfo._4_4_;
  DStack_4d0.m_deviceIface = (DeviceInterface *)colorImageCreateInfo.super_VkImageCreateInfo.pNext;
  colorImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
  colorImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  colorImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_UNDEFINED;
  colorImageCreateInfo.super_VkImageCreateInfo.extent.width = 0;
  if ((VkImageCreateFlags *)depthImageCreateInfo.super_VkImageCreateInfo._0_8_ != pVVar6) {
    operator_delete((void *)depthImageCreateInfo.super_VkImageCreateInfo._0_8_,
                    depthImageCreateInfo.super_VkImageCreateInfo._16_8_ + 1);
  }
  pMVar21 = local_440;
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&attachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  colorImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
  colorImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            ((PipelineLayoutCreateInfo *)&attachmentViewInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&colorImageCreateInfo,0,(VkPushConstantRange *)0x0);
  if (colorImageCreateInfo.super_VkImageCreateInfo._0_8_ != 0) {
    operator_delete((void *)colorImageCreateInfo.super_VkImageCreateInfo._0_8_,
                    colorImageCreateInfo.super_VkImageCreateInfo._16_8_ -
                    colorImageCreateInfo.super_VkImageCreateInfo._0_8_);
  }
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&depthImageCreateInfo,vk,device,
             (VkPipelineLayoutCreateInfo *)&attachmentViewInfo,(VkAllocationCallbacks *)0x0);
  uVar14 = depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
  uVar13 = depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
  pvVar12 = depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  uVar11 = depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
  colorImageCreateInfo.super_VkImageCreateInfo.flags =
       depthImageCreateInfo.super_VkImageCreateInfo.flags;
  colorImageCreateInfo.super_VkImageCreateInfo.imageType =
       depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  colorImageCreateInfo.super_VkImageCreateInfo.format =
       depthImageCreateInfo.super_VkImageCreateInfo.format;
  colorImageCreateInfo.super_VkImageCreateInfo.extent.width =
       depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  colorImageCreateInfo.super_VkImageCreateInfo.sType =
       depthImageCreateInfo.super_VkImageCreateInfo.sType;
  colorImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  colorImageCreateInfo.super_VkImageCreateInfo.pNext =
       depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
  depthImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  depthImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_UNDEFINED;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width = 0;
  obj_01.m_internal =
       (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal;
  if (obj_01.m_internal == 0) {
    (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device =
         (VkDevice)uVar13;
    (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)uVar14;
    (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal = uVar11;
    (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_01);
    (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device =
         (VkDevice)colorImageCreateInfo.super_VkImageCreateInfo._16_8_;
    (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)colorImageCreateInfo.super_VkImageCreateInfo._24_8_;
    (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
         colorImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)colorImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (depthImageCreateInfo.super_VkImageCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
                 &depthImageCreateInfo.super_VkImageCreateInfo.pNext,
                 (VkPipelineLayout)depthImageCreateInfo.super_VkImageCreateInfo._0_8_);
    }
  }
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = (deUint64)&vf_binding_desc;
  vf_binding_desc.binding = 0;
  vf_binding_desc.stride = 0x10;
  vf_binding_desc.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  depthViewInfo.super_VkImageViewCreateInfo.components._0_8_ = &vf_attribute_desc;
  vf_attribute_desc.location = 0;
  vf_attribute_desc.binding = 0;
  vf_attribute_desc.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vf_attribute_desc.offset = 0;
  depthViewInfo.super_VkImageViewCreateInfo.sType =
       VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 1;
  depthViewInfo.super_VkImageViewCreateInfo.viewType = VK_IMAGE_VIEW_TYPE_2D;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineLayout)
             (pMVar21->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal,
             (VkRenderPass)
             (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,0,0);
  pMVar20 = local_448;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&depthImageCreateInfo,
             (VkShaderModule)
             attachments.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_start,"main",VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineShaderStageCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&depthImageCreateInfo,(VkShaderModule)colorAttachmentReference,
             "main",VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineShaderStageCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&depthImageCreateInfo,primitive,0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineInputAssemblyStateCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)&depthImageCreateInfo,1,
             &attachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineColorBlendStateCreateInfo *)&depthImageCreateInfo);
  if (depthImageCreateInfo.super_VkImageCreateInfo._56_8_ != 0) {
    operator_delete((void *)depthImageCreateInfo.super_VkImageCreateInfo._56_8_,
                    (long)depthImageCreateInfo.super_VkImageCreateInfo.pQueueFamilyIndices -
                    depthImageCreateInfo.super_VkImageCreateInfo._56_8_);
  }
  local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->x = 0.0;
  (local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->y = 0.0;
  (local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->width = 128.0;
  (local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->height = 128.0;
  (local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->minDepth = 0.0;
  (local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->maxDepth = 1.0;
  local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  ((local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->offset).x = 0;
  ((local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->offset).y = 0;
  ((local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->extent).width = 0x80;
  ((local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->extent).height = 0x80;
  local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Draw::PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)&depthImageCreateInfo,1,&local_468,&local_428);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineViewportStateCreateInfo *)&depthImageCreateInfo);
  if (depthImageCreateInfo.super_VkImageCreateInfo.pQueueFamilyIndices != (deUint32 *)0x0) {
    operator_delete(depthImageCreateInfo.super_VkImageCreateInfo.pQueueFamilyIndices,
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)depthImageCreateInfo.super_VkImageCreateInfo.pQueueFamilyIndices);
  }
  if (depthImageCreateInfo.super_VkImageCreateInfo._48_8_ != 0) {
    operator_delete((void *)depthImageCreateInfo.super_VkImageCreateInfo._48_8_,
                    depthImageCreateInfo.super_VkImageCreateInfo._64_8_ -
                    depthImageCreateInfo.super_VkImageCreateInfo._48_8_);
  }
  if (local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_388,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_3a8,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_388.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_388.failOp;
  _front.super_VkStencilOpState.passOp = local_388.passOp;
  _front.super_VkStencilOpState.compareOp = local_388.compareOp;
  _front.super_VkStencilOpState.compareMask = local_388.compareMask;
  _front.super_VkStencilOpState.writeMask = local_388.writeMask;
  _front.super_VkStencilOpState.reference = local_388.reference;
  _back.super_VkStencilOpState.depthFailOp = local_3a8.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_3a8.failOp;
  _back.super_VkStencilOpState.passOp = local_3a8.passOp;
  _back.super_VkStencilOpState.compareOp = local_3a8.compareOp;
  _back.super_VkStencilOpState.compareMask = local_3a8.compareMask;
  _back.super_VkStencilOpState.writeMask = local_3a8.writeMask;
  _back.super_VkStencilOpState.reference = local_3a8.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&depthImageCreateInfo,1,1,VK_COMPARE_OP_GREATER_OR_EQUAL,0,0,
             _front,_back,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineDepthStencilStateCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&depthImageCreateInfo,0,0,VK_POLYGON_MODE_FILL,0,
             VK_FRONT_FACE_CLOCKWISE,1,0.0,0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineRasterizationStateCreateInfo *)&depthImageCreateInfo);
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       (deUint64)operator_new(4);
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 4);
  *(undefined4 *)local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       0xffffffff;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)&depthImageCreateInfo,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4f8,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineMultisampleStateCreateInfo *)&depthImageCreateInfo);
  if (depthImageCreateInfo.super_VkImageCreateInfo._48_8_ != 0) {
    operator_delete((void *)depthImageCreateInfo.super_VkImageCreateInfo._48_8_,
                    depthImageCreateInfo.super_VkImageCreateInfo._64_8_ -
                    depthImageCreateInfo.super_VkImageCreateInfo._48_8_);
  }
  if ((undefined4 *)
      local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (undefined4 *)0x0) {
    operator_delete((void *)local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                            m_internal,
                    (long)local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                          m_device -
                    local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                    m_internal);
  }
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineVertexInputStateCreateInfo *)&depthViewInfo);
  ::vk::createGraphicsPipeline
            (&local_4f8,vk,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&colorImageCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar18 = local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar17 = local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar16 = local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar15.m_internal =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo._16_8_ =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  depthImageCreateInfo.super_VkImageCreateInfo._24_8_ =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  depthImageCreateInfo.super_VkImageCreateInfo._0_8_ =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_02.m_internal =
       (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
  if (obj_02.m_internal == 0) {
    (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device = pVVar17;
    (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator = pVVar18;
    (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         HVar15.m_internal;
    (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface = pDVar16
    ;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_02);
    (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
         (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
    (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
    (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (pMVar20->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_4f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_b0 != (pointer)0x0) {
    operator_delete(local_b0,(long)local_a0 - (long)local_b0);
  }
  if (local_c8 != (pointer)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_e0 != (pointer)0x0) {
    operator_delete(local_e0,(long)local_d0 - (long)local_e0);
  }
  if (local_270 != (pointer)0x0) {
    operator_delete(local_270,(long)local_260 - (long)local_270);
  }
  if (local_2d8 != (pointer)0x0) {
    operator_delete(local_2d8,(long)local_2c8 - (long)local_2d8);
  }
  if (attachmentViewInfo.super_VkImageViewCreateInfo._72_8_ != 0) {
    operator_delete((void *)attachmentViewInfo.super_VkImageViewCreateInfo._72_8_,
                    (long)local_3b0 - attachmentViewInfo.super_VkImageViewCreateInfo._72_8_);
  }
  if (attachmentViewInfo.super_VkImageViewCreateInfo.components._8_8_ != 0) {
    operator_delete((void *)attachmentViewInfo.super_VkImageViewCreateInfo.components._8_8_,
                    attachmentViewInfo.super_VkImageViewCreateInfo.subresourceRange._8_8_ -
                    attachmentViewInfo.super_VkImageViewCreateInfo.components._8_8_);
  }
  if (colorAttachmentReference != (VkAttachmentReference)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&DStack_4d0,
               (VkShaderModule)colorAttachmentReference);
  }
  if (attachments.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
               &attachments.
                super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (VkShaderModule)
               attachments.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  Draw::BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&colorImageCreateInfo,(ulong)(uint)numVertices << 4,0x20,
             VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar23 = Context::getDefaultAllocator(this->m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&depthImageCreateInfo,vk,device,(VkBufferCreateInfo *)&colorImageCreateInfo,
             pAVar23,(MemoryRequirement)0x1);
  pSVar7 = (this->m_vertexBuffer).m_state;
  if (pSVar7 != (SharedPtrStateBase *)depthImageCreateInfo.super_VkImageCreateInfo.pNext) {
    if (pSVar7 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar2 = &pSVar7->strongRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        (this->m_vertexBuffer).m_ptr = (Buffer *)0x0;
        (*((this->m_vertexBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar2 = &((this->m_vertexBuffer).m_state)->weakRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        pSVar7 = (this->m_vertexBuffer).m_state;
        if (pSVar7 != (SharedPtrStateBase *)0x0) {
          (*pSVar7->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_vertexBuffer).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_vertexBuffer).m_ptr = (Buffer *)depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (this->m_vertexBuffer).m_state =
         (SharedPtrStateBase *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (depthImageCreateInfo.super_VkImageCreateInfo.pNext == (void *)0x0) goto LAB_006a1e3f;
    LOCK();
    *(int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8) =
         *(int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8) + 1;
    UNLOCK();
    LOCK();
    pdVar2 = &((this->m_vertexBuffer).m_state)->weakRefCount;
    *pdVar2 = *pdVar2 + 1;
    UNLOCK();
  }
  if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
    LOCK();
    piVar3 = (int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8);
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
      (**(code **)(*depthImageCreateInfo.super_VkImageCreateInfo.pNext + 0x10))();
    }
    LOCK();
    piVar3 = (int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 0xc);
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
        (**(code **)(*depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8))();
      }
      depthImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
    }
  }
LAB_006a1e3f:
  if (colorImageCreateInfo.super_VkImageCreateInfo._56_8_ != 0) {
    operator_delete((void *)colorImageCreateInfo.super_VkImageCreateInfo._56_8_,
                    (long)colorImageCreateInfo.super_VkImageCreateInfo.pQueueFamilyIndices -
                    colorImageCreateInfo.super_VkImageCreateInfo._56_8_);
  }
  return;
}

Assistant:

StateObjects::StateObjects (const vk::DeviceInterface&vk, vkt::Context &context, const int numVertices, vk::VkPrimitiveTopology primitive)
	: m_context(context)
	, m_colorAttachmentFormat(vk::VK_FORMAT_R8G8B8A8_UNORM)

{
	vk::VkFormat		depthFormat = vk::VK_FORMAT_D16_UNORM;
	const vk::VkDevice	device		= m_context.getDevice();

	//attachment images and views
	{
		vk::VkExtent3D imageExtent =
		{
			WIDTH,	// width;
			HEIGHT,	// height;
			1		// depth;
		};

		const ImageCreateInfo colorImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
												   vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT);

		m_colorAttachmentImage	= Image::createAndAlloc(vk, device, colorImageCreateInfo, m_context.getDefaultAllocator());

		const ImageViewCreateInfo attachmentViewInfo(m_colorAttachmentImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
		m_attachmentView		= vk::createImageView(vk, device, &attachmentViewInfo);

		ImageCreateInfo depthImageCreateInfo(vk::VK_IMAGE_TYPE_2D, depthFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT);

		m_DepthImage			= Image::createAndAlloc(vk, device, depthImageCreateInfo, m_context.getDefaultAllocator());

		// Construct a depth  view from depth image
		const ImageViewCreateInfo depthViewInfo(m_DepthImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, depthFormat);
		m_depthiew				= vk::createImageView(vk, device, &depthViewInfo);
	}

	{
		// Renderpass and Framebuffer

		RenderPassCreateInfo renderPassCreateInfo;
		renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,									// format
																	vk::VK_SAMPLE_COUNT_1_BIT,								// samples
																	vk::VK_ATTACHMENT_LOAD_OP_CLEAR,						// loadOp
																	vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,					// storeOp
																	vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// stencilLoadOp
																	vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,					// stencilLoadOp
																	vk::VK_IMAGE_LAYOUT_GENERAL,							// initialLauout
																	vk::VK_IMAGE_LAYOUT_GENERAL));							// finalLayout

		renderPassCreateInfo.addAttachment(AttachmentDescription(depthFormat,												// format
																 vk::VK_SAMPLE_COUNT_1_BIT,									// samples
																 vk::VK_ATTACHMENT_LOAD_OP_CLEAR,							// loadOp
																 vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,						// storeOp
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,						// stencilLoadOp
																 vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,						// stencilLoadOp
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,		// initialLauout
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL));	// finalLayout

		const vk::VkAttachmentReference colorAttachmentReference =
		{
			0,															// attachment
			vk::VK_IMAGE_LAYOUT_GENERAL									// layout
		};

		const vk::VkAttachmentReference depthAttachmentReference =
		{
			1,															// attachment
			vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL		// layout
		};

		renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,					// pipelineBindPoint
														   0,													// flags
														   0,													// inputCount
														   DE_NULL,												// pInputAttachments
														   1,													// colorCount
														   &colorAttachmentReference,							// pColorAttachments
														   DE_NULL,												// pResolveAttachments
														   depthAttachmentReference,							// depthStencilAttachment
														   0,													// preserveCount
														   DE_NULL));											// preserveAttachments

		m_renderPass = vk::createRenderPass(vk, device, &renderPassCreateInfo);

		std::vector<vk::VkImageView> attachments(2);
		attachments[0] = *m_attachmentView;
		attachments[1] = *m_depthiew;

		FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, attachments, WIDTH, HEIGHT, 1);
		m_framebuffer = vk::createFramebuffer(vk, device, &framebufferCreateInfo);
	}

	{
		// Pipeline

		vk::Unique<vk::VkShaderModule> vs(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("vert"), 0));
		vk::Unique<vk::VkShaderModule> fs(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("frag"), 0));

		const PipelineCreateInfo::ColorBlendState::Attachment attachmentState;

		const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
		m_pipelineLayout = vk::createPipelineLayout(vk, device, &pipelineLayoutCreateInfo);

		const vk::VkVertexInputBindingDescription vf_binding_desc		=
		{
			0,																// binding;
			4 * (deUint32)sizeof(float),									// stride;
			vk::VK_VERTEX_INPUT_RATE_VERTEX									// inputRate
		};

		const vk::VkVertexInputAttributeDescription vf_attribute_desc	=
		{
			0,																// location;
			0,																// binding;
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,								// format;
			0																// offset;
		};

		const vk::VkPipelineVertexInputStateCreateInfo vf_info			=
		{																	// sType;
			vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// pNext;
			NULL,															// flags;
			0u,																// vertexBindingDescriptionCount;
			1,																// pVertexBindingDescriptions;
			&vf_binding_desc,												// vertexAttributeDescriptionCount;
			1,																// pVertexAttributeDescriptions;
			&vf_attribute_desc
		};

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(primitive));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &attachmentState));
		const vk::VkViewport viewport	=
		{
			0,		// float x;
			0,		// float y;
			WIDTH,	// float width;
			HEIGHT,	// float height;
			0.0f,	// float minDepth;
			1.0f	// float maxDepth;
		};

		const vk::VkRect2D scissor		=
		{
			{
				0,		// deInt32 x
				0,		// deInt32 y
			},		// VkOffset2D	offset;
			{
				WIDTH,	// deInt32 width;
				HEIGHT,	// deInt32 height
			},		// VkExtent2D	extent;
		};
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<vk::VkViewport>(1, viewport), std::vector<vk::VkRect2D>(1, scissor)));
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState(true, true, vk::VK_COMPARE_OP_GREATER_OR_EQUAL));
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(vf_info);
		m_pipeline = vk::createGraphicsPipeline(vk, device, DE_NULL, &pipelineCreateInfo);
	}

	{
		// Vertex buffer
		const size_t kBufferSize = numVertices * sizeof(tcu::Vec4);
		m_vertexBuffer = Buffer::createAndAlloc(vk, device, BufferCreateInfo(kBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);
	}
}